

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Printer::PrintAny
          (Printer *this,Message *message,TextGenerator *generator)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Descriptor *type;
  Message *pMVar5;
  MessageLite *this_00;
  _Base_ptr *pp_Var6;
  LogMessage *pLVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  AlphaNum *in_R8;
  _Base_ptr p_Var10;
  FieldDescriptor *value_field;
  string full_type_name;
  FieldDescriptor *type_url_field;
  string serialized_value;
  DynamicMessageFactory factory;
  undefined1 local_180 [56];
  FieldDescriptor *local_148;
  string local_140;
  string local_120;
  FieldDescriptor *local_100;
  string local_f8;
  string local_d8;
  DynamicMessageFactory local_b8;
  AlphaNum local_90;
  AlphaNum local_60;
  long *plVar4;
  undefined4 extraout_var_01;
  
  bVar2 = internal::GetAnyFieldDescriptors(message,&local_100,&local_148);
  if (!bVar2) {
    return false;
  }
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  (**(code **)(*plVar4 + 0xc0))(&local_120,plVar4,message,local_100);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  bVar2 = internal::ParseAnyTypeUrl(&local_120,&local_140);
  if (bVar2) {
    iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
    type = DescriptorPool::FindMessageTypeByName
                     (*(DescriptorPool **)(*(long *)(CONCAT44(extraout_var_00,iVar3) + 0x10) + 0x10)
                      ,&local_140);
    if (type != (Descriptor *)0x0) {
      DynamicMessageFactory::DynamicMessageFactory(&local_b8);
      pMVar5 = DynamicMessageFactory::GetPrototype(&local_b8,type);
      iVar3 = (*(pMVar5->super_MessageLite)._vptr_MessageLite[3])(pMVar5);
      this_00 = (MessageLite *)CONCAT44(extraout_var_01,iVar3);
      (**(code **)(*plVar4 + 0xc0))(&local_d8,plVar4,message,local_148);
      if (this_00 == (MessageLite *)0x0) {
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0x5f,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::Message>::operator->() const [C = google::protobuf::Message]"
                     );
      }
      bVar2 = MessageLite::ParseFromString(this_00,&local_d8);
      if (bVar2) {
        local_180._0_8_ = "[";
        local_180._8_8_ = (char *)0x1;
        local_90.piece_data_ = local_120._M_dataplus._M_p;
        local_90.piece_size_ = local_120._M_string_length;
        local_60.piece_data_ = "]";
        local_60.piece_size_ = 1;
        StrCat_abi_cxx11_(&local_f8,(protobuf *)local_180,&local_90,&local_60,in_R8);
        TextGenerator::Print(generator,local_f8._M_dataplus._M_p,local_f8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        p_Var10 = (_Base_ptr)(this->default_field_value_printer_).ptr_;
        local_180._0_8_ = p_Var10;
        p_Var9 = (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (p_Var9 != (_Base_ptr)0x0) {
          p_Var1 = &(this->custom_printers_)._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = &p_Var1->_M_header;
          do {
            if (*(FieldDescriptor **)(p_Var9 + 1) >= local_148) {
              p_Var8 = p_Var9;
            }
            p_Var9 = (&p_Var9->_M_left)[*(FieldDescriptor **)(p_Var9 + 1) < local_148];
          } while (p_Var9 != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var8 != p_Var1) {
            pp_Var6 = &p_Var8[1]._M_parent;
            if (local_148 < *(FieldDescriptor **)(p_Var8 + 1)) {
              pp_Var6 = (_Base_ptr *)local_180;
            }
            p_Var10 = *pp_Var6;
          }
        }
        (*(*(_func_int ***)p_Var10)[0xd])
                  (local_180,p_Var10,message,0xffffffff,0,(ulong)this->single_line_mode_);
        TextGenerator::Print(generator,(char *)local_180._0_8_,local_180._8_8_);
        if ((_Base_ptr)local_180._0_8_ != (_Base_ptr)(local_180 + 0x10)) {
          operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
        }
        std::__cxx11::string::append((char *)&generator->indent_);
        Print(this,(Message *)this_00,generator);
        TextGenerator::Outdent(generator);
        (*(*(_func_int ***)p_Var10)[0xe])
                  (local_180,p_Var10,message,0xffffffff,0,(ulong)this->single_line_mode_);
        TextGenerator::Print(generator,(char *)local_180._0_8_,local_180._8_8_);
        if ((_Base_ptr)local_180._0_8_ != (_Base_ptr)(local_180 + 0x10)) {
          operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
        }
      }
      else {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_180,LOGLEVEL_WARNING,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                   ,0x635);
        pLVar7 = internal::LogMessage::operator<<((LogMessage *)local_180,&local_120);
        pLVar7 = internal::LogMessage::operator<<(pLVar7,": failed to parse contents");
        internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar7);
        internal::LogMessage::~LogMessage((LogMessage *)local_180);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      (*this_00->_vptr_MessageLite[1])(this_00);
      DynamicMessageFactory::~DynamicMessageFactory(&local_b8);
      goto LAB_005c1735;
    }
    internal::LogMessage::LogMessage
              ((LogMessage *)local_180,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x62d);
    pLVar7 = internal::LogMessage::operator<<((LogMessage *)local_180,"Proto type ");
    pLVar7 = internal::LogMessage::operator<<(pLVar7,&local_120);
    pLVar7 = internal::LogMessage::operator<<(pLVar7," not found");
    internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar7);
    internal::LogMessage::~LogMessage((LogMessage *)local_180);
  }
  bVar2 = false;
LAB_005c1735:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,
                    CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                             local_140.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool TextFormat::Printer::PrintAny(const Message& message,
                                   TextGenerator& generator) const {
  const FieldDescriptor* type_url_field;
  const FieldDescriptor* value_field;
  if (!internal::GetAnyFieldDescriptors(message, &type_url_field,
                                        &value_field)) {
    return false;
  }

  const Reflection* reflection = message.GetReflection();

  // Extract the full type name from the type_url field.
  const string& type_url = reflection->GetString(message, type_url_field);
  string full_type_name;
  if (!internal::ParseAnyTypeUrl(type_url, &full_type_name)) {
    return false;
  }

  // Print the "value" in text.
  const google::protobuf::Descriptor* value_descriptor =
      message.GetDescriptor()->file()->pool()->FindMessageTypeByName(
          full_type_name);
  if (value_descriptor == NULL) {
    GOOGLE_LOG(WARNING) << "Proto type " << type_url << " not found";
    return false;
  }
  DynamicMessageFactory factory;
  google::protobuf::scoped_ptr<google::protobuf::Message> value_message(
      factory.GetPrototype(value_descriptor)->New());
  string serialized_value = reflection->GetString(message, value_field);
  if (!value_message->ParseFromString(serialized_value)) {
    GOOGLE_LOG(WARNING) << type_url << ": failed to parse contents";
    return false;
  }
  generator.Print(StrCat("[", type_url, "]"));
  const FieldValuePrinter* printer = FindWithDefault(
      custom_printers_, value_field, default_field_value_printer_.get());
  generator.Print(
      printer->PrintMessageStart(message, -1, 0, single_line_mode_));
  generator.Indent();
  Print(*value_message, generator);
  generator.Outdent();
  generator.Print(printer->PrintMessageEnd(message, -1, 0, single_line_mode_));
  return true;
}